

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::hidden::render(hidden *this)

{
  form_context *in_stack_00000058;
  hidden *in_stack_00000060;
  
  render(in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

void hidden::render(form_context &context)
{
	auto_generate(&context);
	std::ostream &output = context.out();
	
	context.widget_part(first_part);
	render_input(context);

	output<<attributes_string();

	context.widget_part(second_part);
	render_input(context);

}